

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdl_beeper.cpp
# Opt level: O1

void __thiscall sdl::beeper::beeper(beeper *this,uint16_t freq,uint8_t amplitude)

{
  uchar uVar1;
  SDL_AudioDeviceID retval;
  ulong uVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  undefined6 in_register_00000032;
  bool bVar4;
  int iVar5;
  bool bVar6;
  size_type __dnew;
  SDL_AudioSpec obtained;
  SDL_AudioSpec desired;
  allocator_type local_b1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  int local_78 [2];
  ushort local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_40;
  
  uVar3 = CONCAT71(in_register_00000011,amplitude) & 0xffffffff;
  (this->m_sample_cache).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_sample_cache).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_sample_cache).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = (int)CONCAT62(in_register_00000032,freq);
  SDL_LogDebug(4,"Creating beeper with %hu Hz and amplitude of %hhu",
               CONCAT62(in_register_00000032,freq) & 0xffffffff,uVar3);
  local_58 = (ulong)CONCAT16(1,CONCAT24(8,iVar5 * 2));
  uStack_50 = 0x20;
  local_48 = beeper::anon_class_1_0_00000001::__invoke;
  pvStack_40 = &this->m_sample_cache;
  retval = SDL_OpenAudioDevice(0,0,&local_58,local_78);
  this->m_audio_device = retval;
  local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = &DAT_0000001b;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_98,(size_type *)&local_b0,0);
  local_98.field_2._M_allocated_capacity =
       (size_type)
       local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  builtin_strncpy(local_98._M_dataplus._M_p,"Unable to open audio device",0x1b);
  local_98._M_string_length =
       (size_type)
       local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_98._M_dataplus._M_p
  [(long)local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start] = '\0';
  sdl_check_error(retval,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,(ulong)(local_98.field_2._M_allocated_capacity + 1));
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_b0,(ulong)local_70,&local_b1);
  if (local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar2 = 0;
    bVar4 = false;
    do {
      bVar6 = uVar2 % (ulong)(long)(int)(CONCAT44(local_78[0] - (local_78[0] >> 0x1f) >> 0x1f,
                                                  local_78[0] / 2) / (long)iVar5) == 0;
      uVar1 = (uchar)uVar3;
      if (bVar4 == bVar6) {
        uVar1 = '\0';
      }
      local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar2] = uVar1;
      uVar2 = uVar2 + 1;
      bVar4 = (bool)(bVar4 ^ bVar6);
    } while (uVar2 < (ulong)((long)local_b0.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_b0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start));
  }
  SDL_LogDebug(4,"Sample cache was generated with %d samples");
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&this->m_sample_cache,&local_b0);
  if (local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

beeper::beeper(uint16_t freq, uint8_t amplitude)
{
	SDL_LogDebug(SDL_LOG_CATEGORY_AUDIO, "Creating beeper with %hu Hz and amplitude of %hhu",
		freq, amplitude);

	SDL_AudioSpec desired;
	SDL_AudioSpec obtained;

	std::memset(&desired, 0, sizeof(desired));

	desired.freq = freq * 2;
	desired.format = AUDIO_U8;
	desired.channels = 1;
	desired.samples = 32; // TODO: Tune this, since this is a throughput-vs-latency thing
	desired.callback = +[](void* user_data, Uint8* stream, int len) -> void
	{
		if (len == 0)
			return;

		const auto& buffer = *reinterpret_cast<std::vector<uint8_t>*>(user_data);
		if (len > buffer.size())
		{
			SDL_LogWarn(SDL_LOG_CATEGORY_AUDIO, "More samples requested than was cached, "
				"truncating with silence. Requested: %d, cached: %d", len, buffer.size());

			std::memset(stream + buffer.size(), 0, len - buffer.size());
			len = buffer.size();
		}
		std::memcpy(stream, buffer.data(), len);
	};
	desired.userdata = &this->m_sample_cache;

	this->m_audio_device = SDL_OpenAudioDevice(nullptr, 0, &desired, &obtained,
		SDL_AUDIO_ALLOW_FREQUENCY_CHANGE);
	sdl::sdl_check_error(this->m_audio_device, "Unable to open audio device"s);

	this->m_sample_cache = generate_sample_cache(obtained, freq, amplitude);
}